

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void calc_proj_params_r0_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int64_t (*H) [2],int64_t *C)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int32_t f1;
  int32_t s;
  int32_t u;
  int j;
  int i;
  uint8_t *dat;
  uint8_t *src;
  int size;
  int dat_stride_local;
  uint8_t *dat8_local;
  int src_stride_local;
  int height_local;
  int width_local;
  uint8_t *src8_local;
  
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      bVar1 = dat8[i * dat_stride + j];
      bVar2 = src8[i * src_stride + j];
      iVar3 = flt0[i * flt0_stride + j] + (uint)bVar1 * -0x10;
      (*H)[0] = (long)iVar3 * (long)iVar3 + (*H)[0];
      *C = (long)iVar3 * (long)(int)((uint)bVar2 * 0x10 + (uint)bVar1 * -0x10) + *C;
    }
  }
  (*H)[0] = (*H)[0] / (long)(width * height);
  *C = *C / (long)(width * height);
  return;
}

Assistant:

static inline void calc_proj_params_r0_c(const uint8_t *src8, int width,
                                         int height, int src_stride,
                                         const uint8_t *dat8, int dat_stride,
                                         int32_t *flt0, int flt0_stride,
                                         int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int32_t u = (int32_t)(dat[i * dat_stride + j] << SGRPROJ_RST_BITS);
      const int32_t s =
          (int32_t)(src[i * src_stride + j] << SGRPROJ_RST_BITS) - u;
      const int32_t f1 = (int32_t)flt0[i * flt0_stride + j] - u;
      H[0][0] += (int64_t)f1 * f1;
      C[0] += (int64_t)f1 * s;
    }
  }
  H[0][0] /= size;
  C[0] /= size;
}